

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_encoder.c
# Opt level: O0

lzma_ret lzma_lzma_encoder_reset(lzma_lzma1_encoder *coder,lzma_options_lzma *options)

{
  _Bool _Var1;
  uint local_50;
  uint local_4c;
  uint32_t bt_i_1;
  uint32_t bt_i;
  size_t i_3;
  size_t i_2;
  size_t j;
  size_t i_1;
  size_t i;
  lzma_options_lzma *options_local;
  lzma_lzma1_encoder *coder_local;
  
  _Var1 = is_options_valid(options);
  if (_Var1) {
    coder->pos_mask = (1 << ((byte)options->pb & 0x1f)) - 1;
    coder->literal_context_bits = options->lc;
    coder->literal_pos_mask = (1 << ((byte)options->lp & 0x1f)) - 1;
    rc_reset(&coder->rc);
    coder->state = STATE_LIT_LIT;
    for (i_1 = 0; i_1 < 4; i_1 = i_1 + 1) {
      coder->reps[i_1] = 0;
    }
    literal_init(coder->literal,options->lc,options->lp);
    for (j = 0; j < 0xc; j = j + 1) {
      for (i_2 = 0; i_2 <= coder->pos_mask; i_2 = i_2 + 1) {
        coder->is_match[j][i_2] = 0x400;
        coder->is_rep0_long[j][i_2] = 0x400;
      }
      coder->is_rep[j] = 0x400;
      coder->is_rep0[j] = 0x400;
      coder->is_rep1[j] = 0x400;
      coder->is_rep2[j] = 0x400;
    }
    for (i_3 = 0; i_3 < 0x72; i_3 = i_3 + 1) {
      coder->dist_special[i_3] = 0x400;
    }
    for (_bt_i_1 = 0; _bt_i_1 < 4; _bt_i_1 = _bt_i_1 + 1) {
      for (local_4c = 0; local_4c < 0x40; local_4c = local_4c + 1) {
        coder->dist_slot[_bt_i_1][local_4c] = 0x400;
      }
    }
    for (local_50 = 0; local_50 < 0x10; local_50 = local_50 + 1) {
      coder->dist_align[local_50] = 0x400;
    }
    length_encoder_reset
              (&coder->match_len_encoder,1 << ((byte)options->pb & 0x1f),
               (_Bool)(coder->fast_mode & 1));
    length_encoder_reset
              (&coder->rep_len_encoder,1 << ((byte)options->pb & 0x1f),(_Bool)(coder->fast_mode & 1)
              );
    coder->match_price_count = 0x7fffffff;
    coder->align_price_count = 0x7fffffff;
    coder->opts_end_index = 0;
    coder->opts_current_index = 0;
    coder_local._4_4_ = LZMA_OK;
  }
  else {
    coder_local._4_4_ = LZMA_OPTIONS_ERROR;
  }
  return coder_local._4_4_;
}

Assistant:

extern lzma_ret
lzma_lzma_encoder_reset(lzma_lzma1_encoder *coder,
		const lzma_options_lzma *options)
{
	if (!is_options_valid(options))
		return LZMA_OPTIONS_ERROR;

	coder->pos_mask = (1U << options->pb) - 1;
	coder->literal_context_bits = options->lc;
	coder->literal_pos_mask = (1U << options->lp) - 1;

	// Range coder
	rc_reset(&coder->rc);

	// State
	coder->state = STATE_LIT_LIT;
	for (size_t i = 0; i < REPS; ++i)
		coder->reps[i] = 0;

	literal_init(coder->literal, options->lc, options->lp);

	// Bit encoders
	for (size_t i = 0; i < STATES; ++i) {
		for (size_t j = 0; j <= coder->pos_mask; ++j) {
			bit_reset(coder->is_match[i][j]);
			bit_reset(coder->is_rep0_long[i][j]);
		}

		bit_reset(coder->is_rep[i]);
		bit_reset(coder->is_rep0[i]);
		bit_reset(coder->is_rep1[i]);
		bit_reset(coder->is_rep2[i]);
	}

	for (size_t i = 0; i < FULL_DISTANCES - DIST_MODEL_END; ++i)
		bit_reset(coder->dist_special[i]);

	// Bit tree encoders
	for (size_t i = 0; i < DIST_STATES; ++i)
		bittree_reset(coder->dist_slot[i], DIST_SLOT_BITS);

	bittree_reset(coder->dist_align, ALIGN_BITS);

	// Length encoders
	length_encoder_reset(&coder->match_len_encoder,
			1U << options->pb, coder->fast_mode);

	length_encoder_reset(&coder->rep_len_encoder,
			1U << options->pb, coder->fast_mode);

	// Price counts are incremented every time appropriate probabilities
	// are changed. price counts are set to zero when the price tables
	// are updated, which is done when the appropriate price counts have
	// big enough value, and lzma_mf.read_ahead == 0 which happens at
	// least every OPTS (a few thousand) possible price count increments.
	//
	// By resetting price counts to UINT32_MAX / 2, we make sure that the
	// price tables will be initialized before they will be used (since
	// the value is definitely big enough), and that it is OK to increment
	// price counts without risk of integer overflow (since UINT32_MAX / 2
	// is small enough). The current code doesn't increment price counts
	// before initializing price tables, but it maybe done in future if
	// we add support for saving the state between LZMA2 chunks.
	coder->match_price_count = UINT32_MAX / 2;
	coder->align_price_count = UINT32_MAX / 2;

	coder->opts_end_index = 0;
	coder->opts_current_index = 0;

	return LZMA_OK;
}